

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::GetEnumFileName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          EnumDescriptor *desc,bool with_package)

{
  char cVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar2 = (int)desc;
  cVar1 = (char)desc;
  std::operator+(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
                 ,"/");
  if (iVar2 == 0) {
    std::__cxx11::string::string((string *)&local_100,"",(allocator *)&local_120);
  }
  else {
    GetNamespace_abi_cxx11_
              (&local_a0,this,
               (GeneratorOptions *)(options->output_dir).field_2._M_allocated_capacity,
               (FileDescriptor *)desc);
    std::operator+(&local_120,&local_a0,"_");
    anon_unknown_0::ToLower(&local_100,&local_120);
  }
  std::operator+(&local_60,&local_80,&local_100);
  anon_unknown_0::ToLower(&local_c0,(string *)(options->output_dir)._M_string_length);
  std::operator+(&local_40,&local_60,&local_c0);
  GeneratorOptions::GetFileNameExtension_abi_cxx11_(&local_e0,(GeneratorOptions *)this);
  std::operator+(__return_storage_ptr__,&local_40,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_100);
  if (cVar1 != '\0') {
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::string GetEnumFileName(const GeneratorOptions& options,
                            const EnumDescriptor* desc, bool with_package) {
  return options.output_dir + "/" +
         (with_package ? ToLower(GetNamespace(options, desc->file()) + "_")
                       : "") +
         ToLower(desc->name()) + options.GetFileNameExtension();
}